

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void * Fossilize::pnext_chain_skip_ignored_entries(void *pNext)

{
  int iVar1;
  
  for (; ((int *)pNext != (int *)0x0 &&
         ((((iVar1 = *pNext, iVar1 + 0xc45e38eeU < 2 || (iVar1 == 0x3b9cbe00)) ||
           (iVar1 == 0x3b9d3b01)) ||
          (((iVar1 == 0x3b9db800 || (iVar1 == 0x3ba228ba)) || (iVar1 == 0x3b9e8ed8))))));
      pNext = *(void **)((long)pNext + 8)) {
  }
  return pNext;
}

Assistant:

static const void *pnext_chain_skip_ignored_entries(const void *pNext)
{
	while (pNext)
	{
		auto *base = static_cast<const VkBaseInStructure *>(pNext);
		bool ignored;

		switch (base->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_CREATION_FEEDBACK_CREATE_INFO_EXT:
		case VK_STRUCTURE_TYPE_SHADER_MODULE_VALIDATION_CACHE_CREATE_INFO_EXT:
		case VK_STRUCTURE_TYPE_DEBUG_UTILS_OBJECT_NAME_INFO_EXT:
		case VK_STRUCTURE_TYPE_VALIDATION_FEATURES_EXT:
		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_FEEDBACK_CREATE_INFO_EXT:
		case VK_STRUCTURE_TYPE_RENDER_PASS_SUBPASS_FEEDBACK_CREATE_INFO_EXT:
		case VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR:
			// We need to ignore any pNext struct which represents output information from a pipeline object, or
			// irrelevant information which only tooling would care about.
			ignored = true;
			break;

		default:
			ignored = false;
			break;
		}

		if (ignored)
			pNext = base->pNext;
		else
			break;
	}

	return pNext;
}